

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidatorPushAttribute
              (xmlSchemaValidCtxtPtr vctxt,xmlNodePtr attrNode,int nodeLine,xmlChar *localName,
              xmlChar *nsName,int ownedNames,xmlChar *value,int ownedValue)

{
  int iVar1;
  xmlSchemaAttrInfoPtr pxVar2;
  xmlSchemaAttrInfoPtr attr;
  int ownedNames_local;
  xmlChar *nsName_local;
  xmlChar *localName_local;
  int nodeLine_local;
  xmlNodePtr attrNode_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  pxVar2 = xmlSchemaGetFreshAttrInfo(vctxt);
  if (pxVar2 == (xmlSchemaAttrInfoPtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaPushAttribute",
               "calling xmlSchemaGetFreshAttrInfo()");
    vctxt_local._4_4_ = -1;
  }
  else {
    pxVar2->node = attrNode;
    pxVar2->nodeLine = nodeLine;
    pxVar2->state = 1;
    pxVar2->localName = localName;
    pxVar2->nsName = nsName;
    if (ownedNames != 0) {
      pxVar2->flags = pxVar2->flags | 1;
    }
    if (nsName != (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(localName,(xmlChar *)"nil");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(localName,"type");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(localName,"schemaLocation");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(localName,(xmlChar *)"noNamespaceSchemaLocation");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(pxVar2->nsName,xmlNamespaceNs);
              if (iVar1 != 0) {
                pxVar2->metaType = 5;
              }
            }
            else {
              iVar1 = xmlStrEqual(pxVar2->nsName,xmlSchemaInstanceNs);
              if (iVar1 != 0) {
                pxVar2->metaType = 4;
              }
            }
          }
          else {
            iVar1 = xmlStrEqual(pxVar2->nsName,xmlSchemaInstanceNs);
            if (iVar1 != 0) {
              pxVar2->metaType = 3;
            }
          }
        }
        else {
          iVar1 = xmlStrEqual(pxVar2->nsName,xmlSchemaInstanceNs);
          if (iVar1 != 0) {
            pxVar2->metaType = 1;
          }
        }
      }
      else {
        iVar1 = xmlStrEqual(pxVar2->nsName,xmlSchemaInstanceNs);
        if (iVar1 != 0) {
          pxVar2->metaType = 2;
        }
      }
    }
    pxVar2->value = value;
    if (ownedValue != 0) {
      pxVar2->flags = pxVar2->flags | 2;
    }
    if (pxVar2->metaType != 0) {
      pxVar2->state = 0x11;
    }
    vctxt_local._4_4_ = 0;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidatorPushAttribute(xmlSchemaValidCtxtPtr vctxt,
			xmlNodePtr attrNode,
			int nodeLine,
			const xmlChar *localName,
			const xmlChar *nsName,
			int ownedNames,
			xmlChar *value,
			int ownedValue)
{
    xmlSchemaAttrInfoPtr attr;

    attr = xmlSchemaGetFreshAttrInfo(vctxt);
    if (attr == NULL) {
	VERROR_INT("xmlSchemaPushAttribute",
	    "calling xmlSchemaGetFreshAttrInfo()");
	return (-1);
    }
    attr->node = attrNode;
    attr->nodeLine = nodeLine;
    attr->state = XML_SCHEMAS_ATTR_UNKNOWN;
    attr->localName = localName;
    attr->nsName = nsName;
    if (ownedNames)
	attr->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES;
    /*
    * Evaluate if it's an XSI attribute.
    */
    if (nsName != NULL) {
	if (xmlStrEqual(localName, BAD_CAST "nil")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_NIL;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "type")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_TYPE;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "schemaLocation")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_SCHEMA_LOC;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "noNamespaceSchemaLocation")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_NO_NS_SCHEMA_LOC;
	    }
	} else if (xmlStrEqual(attr->nsName, xmlNamespaceNs)) {
	    attr->metaType = XML_SCHEMA_ATTR_INFO_META_XMLNS;
	}
    }
    attr->value = value;
    if (ownedValue)
	attr->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
    if (attr->metaType != 0)
	attr->state = XML_SCHEMAS_ATTR_META;
    return (0);
}